

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O0

void __thiscall
OpenMD::StringTokenizer::StringTokenizer
          (StringTokenizer *this,string *str,string *delim,bool returnTokens)

{
  string *this_00;
  byte in_CL;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff98;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  in_RDI[0x40] = (string)(in_CL & 1);
  this_00 = in_RDI + 0x48;
  std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00,in_stack_ffffffffffffff98);
  std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00,in_stack_ffffffffffffff98);
  return;
}

Assistant:

StringTokenizer::StringTokenizer(const std::string& str,
                                   const std::string& delim,
                                   bool returnTokens) :
      tokenString_(str),
      delim_(delim), returnTokens_(returnTokens),
      currentPos_(tokenString_.begin()), end_(tokenString_.end()) {}